

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O0

shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> __thiscall
CoreML::Recommender::constructAndValidateItemSimilarityRecommenderFromSpec
          (Recommender *this,Model *spec)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *paVar1;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  bool bVar2;
  int32 modelVersion;
  int iVar3;
  uchar interface_00 [8];
  invalid_argument *piVar4;
  string *psVar5;
  ItemSimilarityRecommender *from;
  ulong uVar6;
  FeatureDescription *this_00;
  CoreML *pCVar7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> sVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_420;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_315;
  TypeCase local_314;
  iterator local_310;
  size_type local_308;
  undefined1 local_300 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_2bd;
  TypeCase local_2bc;
  iterator local_2b8;
  size_type local_2b0;
  undefined1 local_2a8 [71];
  byte local_261;
  undefined1 local_260 [7];
  bool output_column_specified;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_238;
  _Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *n;
  const_iterator_conflict __end2;
  const_iterator_conflict __begin2;
  undefined1 local_218 [64];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
  *__range2;
  TypeCase local_1b8 [2];
  iterator local_1b0;
  size_type local_1a8;
  undefined1 local_1a0 [8];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types_1;
  undefined1 local_170 [64];
  Result local_130;
  undefined4 local_100;
  undefined4 local_fc;
  uchar *local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types;
  undefined1 local_c8 [8];
  ItemSimilarityRecommender isr;
  Result local_48;
  ModelDescription *interface;
  Model *spec_local;
  shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> *ret;
  
  interface = (ModelDescription *)spec;
  spec_local = (Model *)this;
  interface_00 = (uchar  [8])Specification::Model::description(spec);
  local_48.m_message._M_storage._M_storage = interface_00;
  modelVersion = Specification::Model::specificationversion((Model *)interface);
  validateModelDescription(&local_48,(ModelDescription *)interface_00,modelVersion);
  bVar2 = Result::good(&local_48);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_(&local_48);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = Specification::Model::has_itemsimilarityrecommender((Model *)interface);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_(&local_48);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  from = Specification::Model::itemsimilarityrecommender((Model *)interface);
  Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
            ((ItemSimilarityRecommender *)local_c8,from);
  allowed_item_input_types.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  make_shared<CoreML::Recommender::_ItemSimilarityRecommenderData,CoreML::Specification::ItemSimilarityRecommender&>
            ((ItemSimilarityRecommender *)this);
  std::
  __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    iVar3 = Specification::ModelDescription::input_size
                      ((ModelDescription *)local_48.m_message._M_storage._M_storage);
    if (iVar3 != 1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,"Name of column for item input data not specified.");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    this_00 = Specification::ModelDescription::input
                        ((ModelDescription *)local_48.m_message._M_storage._M_storage,0);
    psVar5 = Specification::FeatureDescription::name_abi_cxx11_(this_00);
    peVar8 = std::
             __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=
              ((string *)&(peVar8->item_exclusion_input_column)._M_storage,(string *)psVar5);
  }
  local_130.m_message._M_storage._M_storage[4] = '\x06';
  local_130.m_message._M_storage._M_storage[5] = '\0';
  local_130.m_message._M_storage._M_storage[6] = '\0';
  local_130.m_message._M_storage._M_storage[7] = '\0';
  local_100 = 7;
  local_fc = 5;
  local_f8 = local_130.m_message._M_storage._M_storage + 4;
  local_f0 = 3;
  paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
           (local_130.m_message._M_storage._M_storage + 3);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
  __l_03._M_len = local_f0;
  __l_03._M_array = (iterator)local_f8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_e8,__l_03,paVar1);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
             (local_130.m_message._M_storage._M_storage + 3));
  pCVar7 = (CoreML *)
           Specification::ModelDescription::input
                     ((ModelDescription *)local_48.m_message._M_storage._M_storage);
  peVar8 = std::
           __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_130,pCVar7,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
             &(peVar8->item_exclusion_input_column)._M_storage,(string *)local_e8,in_R8);
  Result::operator=(&local_48,&local_130);
  Result::~Result(&local_130);
  bVar2 = Result::good(&local_48);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_(&local_48);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_e8);
  std::
  __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pCVar7 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)local_48.m_message._M_storage._M_storage);
    peVar8 = std::
             __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    allowed_item_input_types_1.
    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
             ((long)&allowed_item_input_types_1.
                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
    __l_02._M_len = 1;
    __l_02._M_array =
         (iterator)
         ((long)&allowed_item_input_types_1.
                 super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_170,__l_02,paVar1);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)(local_170 + 0x18),pCVar7,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
               &(peVar8->item_restriction_input_column)._M_storage,(string *)local_170,in_R8);
    Result::operator=(&local_48,(Result *)(local_170 + 0x18));
    Result::~Result((Result *)(local_170 + 0x18));
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_170);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&allowed_item_input_types_1.
                       super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    bVar2 = Result::good(&local_48);
    if (!bVar2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar5 = Result::message_abi_cxx11_(&local_48);
      std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_1b8[0] = kSequenceType;
  local_1b8[1] = 5;
  local_1b0 = local_1b8;
  local_1a8 = 2;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&__range2 + 7));
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_1a0,__l_01,
           (allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&__range2 + 7));
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&__range2 + 7));
  __begin2 = (const_iterator_conflict)local_218;
  peVar8 = std::
           __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::string((string *)local_218,(string *)&peVar8->item_exclusion_input_column);
  __begin2 = (const_iterator_conflict)(local_218 + 0x20);
  peVar8 = std::
           __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::string
            ((string *)(local_218 + 0x20),(string *)&peVar8->item_restriction_input_column);
  local_1d8._M_array = (iterator)local_218;
  local_1d8._M_len = 2;
  local_1c8 = &local_1d8;
  __end2 = (const_iterator_conflict)
           std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(local_1c8);
  n = (_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
       *)std::
         initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::end(local_1c8);
  for (; __end2 != n; __end2 = (const_iterator_conflict)&__end2->_M_storage) {
    local_238._M_storage = (uchar  [8])__end2;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pCVar7 = (CoreML *)
               Specification::ModelDescription::input
                         ((ModelDescription *)local_48.m_message._M_storage._M_storage);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_260,pCVar7,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)local_238._M_storage
                 ,(string *)local_1a0,in_R8);
      Result::operator=(&local_48,(Result *)local_260);
      Result::~Result((Result *)local_260);
      bVar2 = Result::good(&local_48);
      if (!bVar2) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        psVar5 = Result::message_abi_cxx11_(&local_48);
        std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  local_420 = &local_1d8;
  do {
    local_420 = local_420 + -2;
    std::__cxx11::string::~string((string *)local_420);
  } while (local_420 !=
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_218);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_1a0);
  local_261 = 0;
  std::
  __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pCVar7 = (CoreML *)
             Specification::ModelDescription::output
                       ((ModelDescription *)local_48.m_message._M_storage._M_storage);
    peVar8 = std::
             __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_2bc = kDictionaryType;
    local_2b8 = &local_2bc;
    local_2b0 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_2bd);
    __l_00._M_len = local_2b0;
    __l_00._M_array = local_2b8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_2a8,__l_00,&local_2bd);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)(local_2a8 + 0x18),pCVar7,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
               &(peVar8->item_list_output_column)._M_storage,(string *)local_2a8,in_R8);
    Result::operator=(&local_48,(Result *)(local_2a8 + 0x18));
    Result::~Result((Result *)(local_2a8 + 0x18));
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_2a8);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_2bd);
    bVar2 = Result::good(&local_48);
    if (!bVar2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar5 = Result::message_abi_cxx11_(&local_48);
      std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_261 = 1;
  }
  std::
  __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pCVar7 = (CoreML *)
             Specification::ModelDescription::output
                       ((ModelDescription *)local_48.m_message._M_storage._M_storage);
    peVar8 = std::
             __shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_314 = kSequenceType;
    local_310 = &local_314;
    local_308 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_315);
    __l._M_len = local_308;
    __l._M_array = local_310;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_300,__l,&local_315);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)(local_300 + 0x18),pCVar7,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
               &peVar8->item_list_output_column,(string *)local_300,in_R8);
    Result::operator=(&local_48,(Result *)(local_300 + 0x18));
    Result::~Result((Result *)(local_300 + 0x18));
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_300);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_315);
    bVar2 = Result::good(&local_48);
    if (!bVar2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar5 = Result::message_abi_cxx11_(&local_48);
      std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_261 = 1;
  }
  if ((local_261 & 1) == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"No output columns specified.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  allowed_item_input_types.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  Specification::ItemSimilarityRecommender::~ItemSimilarityRecommender
            ((ItemSimilarityRecommender *)local_c8);
  Result::~Result(&local_48);
  sVar9.
  super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar9.
  super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData>)
         sVar9.
         super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<_ItemSimilarityRecommenderData>
  constructAndValidateItemSimilarityRecommenderFromSpec(const Specification::Model& spec){
    const auto& interface = spec.description();

      // Validate its a MLModel type.
    auto result = validateModelDescription(interface, spec.specificationversion());

    if(!result.good()) {
      throw std::invalid_argument(result.message());
    }

    /** Preliminary. -- get the right tree parameters out to get all the nodes.
     */
    if(!spec.has_itemsimilarityrecommender()) {
      throw std::invalid_argument(result.message());
    }

    auto isr = spec.itemsimilarityrecommender();

    auto ret = std::make_shared<_ItemSimilarityRecommenderData>(isr);

    // Perform validation on the constructed data set

    // Validate the input column
    {
      if(ret->item_data_input_column.empty()) {
        if(interface.input_size() == 1) {
          ret->item_data_input_column = interface.input(0).name();
        } else {
          throw std::invalid_argument("Name of column for item input data not specified.");
        }
      }

      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kDictionaryType,
        Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                 ret->item_data_input_column,
                                                                 allowed_item_input_types);
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
    }

    // Now validate the num recommendations input
    {

      if(!ret->num_recommendations_input_column.empty()) {
        result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                   ret->num_recommendations_input_column,
                                                                   {Specification::FeatureType::kInt64Type});
        if(!result.good()) {
          throw std::invalid_argument(result.message());
        }
      }
    }

    // Now test the more advanced item inclusion and exclusion columns.
    {
      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      for(const auto& n : {ret->item_exclusion_input_column, ret->item_restriction_input_column}) {
        if(!n.empty()) {
          result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                     n,
                                                                     allowed_item_input_types);

          if(!result.good()) {
            throw std::invalid_argument(result.message());
          }
        }
      }
    }

    // Now validate the num recommendations output
    bool output_column_specified = false;
    if(!ret->item_score_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_score_output_column,
                                                                 {Specification::FeatureType::kDictionaryType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    // Now validate the num recommendations output
    if(!ret->item_list_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_list_output_column,
                                                                 {Specification::FeatureType::kSequenceType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    if(!output_column_specified) {
      throw std::invalid_argument("No output columns specified.");
    }

    return ret;
  }